

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::ParseSubstitution(State *state,bool accept_std)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  bool bVar4;
  State *state_00;
  byte in_SIL;
  State *in_RDI;
  AbbrevPair *p;
  ParseState copy;
  ComplexityGuard guard;
  char *in_stack_ffffffffffffff98;
  State *in_stack_ffffffffffffffa0;
  undefined **local_50;
  char *in_stack_ffffffffffffffc0;
  undefined8 uVar5;
  State *in_stack_ffffffffffffffc8;
  ComplexityGuard local_20;
  undefined7 in_stack_ffffffffffffffe8;
  bool local_1;
  
  bVar3 = in_SIL & 1;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_20,in_RDI);
  bVar4 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_20);
  if (bVar4) {
    local_1 = false;
  }
  else {
    bVar4 = ParseTwoCharToken(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    if (bVar4) {
      MaybeAppend(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      local_1 = true;
    }
    else {
      uVar1 = (in_RDI->parse_state).mangled_idx;
      uVar2 = (in_RDI->parse_state).out_cur_idx;
      uVar5 = *(undefined8 *)&(in_RDI->parse_state).prev_name_idx;
      bVar4 = ParseOneCharToken(in_stack_ffffffffffffffc8,(char)((ulong)uVar5 >> 0x38));
      if (((bVar4) &&
          (bVar4 = ParseSeqId((State *)CONCAT17(bVar3,in_stack_ffffffffffffffe8)), bVar4)) &&
         (bVar4 = ParseOneCharToken(in_stack_ffffffffffffffc8,(char)((ulong)uVar5 >> 0x38)), bVar4))
      {
        MaybeAppend(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        local_1 = true;
      }
      else {
        (in_RDI->parse_state).mangled_idx = uVar1;
        (in_RDI->parse_state).out_cur_idx = uVar2;
        *(undefined8 *)&(in_RDI->parse_state).prev_name_idx = uVar5;
        bVar4 = ParseOneCharToken(in_stack_ffffffffffffffc8,(char)((ulong)uVar5 >> 0x38));
        if (bVar4) {
          for (local_50 = &kSubstitutionList; *local_50 != (undefined *)0x0; local_50 = local_50 + 3
              ) {
            state_00 = (State *)RemainingInput(in_RDI);
            if ((*(char *)&state_00->mangled_begin == (*local_50)[1]) &&
               (((bVar3 & 1) != 0 || ((*local_50)[1] != 't')))) {
              MaybeAppend(state_00,in_stack_ffffffffffffff98);
              if (*local_50[1] != '\0') {
                MaybeAppend(state_00,in_stack_ffffffffffffff98);
                MaybeAppend(state_00,in_stack_ffffffffffffff98);
              }
              (in_RDI->parse_state).mangled_idx = (in_RDI->parse_state).mangled_idx + 1;
              anon_unknown_3::UpdateHighWaterMark(in_RDI);
              local_1 = true;
              goto LAB_003d4161;
            }
          }
        }
        (in_RDI->parse_state).mangled_idx = uVar1;
        (in_RDI->parse_state).out_cur_idx = uVar2;
        *(undefined8 *)&(in_RDI->parse_state).prev_name_idx = uVar5;
        local_1 = false;
      }
    }
  }
LAB_003d4161:
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_20);
  return local_1;
}

Assistant:

static bool ParseSubstitution(State *state, bool accept_std) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  if (ParseTwoCharToken(state, "S_")) {
    MaybeAppend(state, "?");  // We don't support substitutions.
    return true;
  }

  ParseState copy = state->parse_state;
  if (ParseOneCharToken(state, 'S') && ParseSeqId(state) &&
      ParseOneCharToken(state, '_')) {
    MaybeAppend(state, "?");  // We don't support substitutions.
    return true;
  }
  state->parse_state = copy;

  // Expand abbreviations like "St" => "std".
  if (ParseOneCharToken(state, 'S')) {
    const AbbrevPair *p;
    for (p = kSubstitutionList; p->abbrev != nullptr; ++p) {
      if (RemainingInput(state)[0] == p->abbrev[1] &&
          (accept_std || p->abbrev[1] != 't')) {
        MaybeAppend(state, "std");
        if (p->real_name[0] != '\0') {
          MaybeAppend(state, "::");
          MaybeAppend(state, p->real_name);
        }
        ++state->parse_state.mangled_idx;
        UpdateHighWaterMark(state);
        return true;
      }
    }
  }
  state->parse_state = copy;
  return false;
}